

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::update_active_builtins(Compiler *this)

{
  SPIRFunction *func;
  ActiveBuiltinHandler handler;
  OpcodeHandler local_20;
  Compiler *local_18;
  
  Bitset::reset(&this->active_input_builtins);
  Bitset::reset(&this->active_output_builtins);
  this->clip_distance_count = 0;
  this->cull_distance_count = 0;
  local_20._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_003a7618;
  local_18 = this;
  func = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_20);
  return;
}

Assistant:

void Compiler::update_active_builtins()
{
	active_input_builtins.reset();
	active_output_builtins.reset();
	cull_distance_count = 0;
	clip_distance_count = 0;
	ActiveBuiltinHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
}